

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void gt_tval_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,int timeridx,uint64_t value)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int64_t iVar3;
  undefined4 in_register_00000014;
  
  if (((int)ri == 4) || ((int)ri == 1)) {
    uVar1 = gt_virt_cnt_offset(env);
  }
  else {
    uVar1 = 0;
  }
  uVar2 = gt_get_countervalue(env);
  iVar3 = sextract64(CONCAT44(in_register_00000014,timeridx),0,0x20);
  (env->cp15).c14_timer[(ulong)ri & 0xffffffff].cval = iVar3 + (uVar2 - uVar1);
  return;
}

Assistant:

static void gt_tval_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          int timeridx,
                          uint64_t value)
{
    uint64_t offset = 0;

    switch (timeridx) {
    case GTIMER_VIRT:
    case GTIMER_HYPVIRT:
        offset = gt_virt_cnt_offset(env);
        break;
    }

    env->cp15.c14_timer[timeridx].cval = gt_get_countervalue(env) - offset +
                                         sextract64(value, 0, 32);
    gt_recalc_timer(env_archcpu(env), timeridx);
}